

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_f13469::HandleTargetMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName)

{
  cmValue this;
  string *psVar1;
  OutType OVar2;
  bool bVar3;
  ulong uVar4;
  cmMakefile *pcVar5;
  cmMakefile *this_00;
  cmGlobalGenerator *this_01;
  char *pcVar6;
  string local_b0;
  string *local_90;
  string *local_88;
  cmValue local_80;
  cmValue prop;
  cmTarget *target;
  allocator<char> local_59;
  string local_58;
  string *local_38;
  string *propertyName_local;
  string *variable_local;
  string *psStack_20;
  OutType infoType_local;
  string *name_local;
  cmExecutionStatus *status_local;
  
  local_38 = propertyName;
  propertyName_local = variable;
  variable_local._4_4_ = infoType;
  psStack_20 = name;
  name_local = (string *)status;
  uVar4 = std::__cxx11::string::empty();
  psVar1 = name_local;
  if ((uVar4 & 1) == 0) {
    pcVar5 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
    prop.Value = (string *)cmMakefile::FindTargetToUse(pcVar5,psStack_20,false);
    psVar1 = name_local;
    if (prop.Value == (string *)0x0) {
      cmStrCat<char_const(&)[23],std::__cxx11::string_const&,char_const(&)[40]>
                (&local_b0,(char (*) [23])"could not find TARGET ",psStack_20,
                 (char (*) [40])".  Perhaps it has not yet been created.");
      cmExecutionStatus::SetError((cmExecutionStatus *)psVar1,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      status_local._7_1_ = false;
    }
    else {
      bVar3 = std::operator==(local_38,"ALIASED_TARGET");
      if ((bVar3) ||
         (bVar3 = std::operator==(local_38,"ALIAS_GLOBAL"), psVar1 = local_38, this = prop, bVar3))
      {
        pcVar5 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
        bVar3 = cmMakefile::IsAlias(pcVar5,psStack_20);
        if (bVar3) {
          bVar3 = std::operator==(local_38,"ALIASED_TARGET");
          OVar2 = variable_local._4_4_;
          if (bVar3) {
            pcVar5 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
            psVar1 = propertyName_local;
            cmTarget::GetName_abi_cxx11_((cmTarget *)prop.Value);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            bVar3 = (anonymous_namespace)::StoreResult<char_const*>(OVar2,pcVar5,psVar1,pcVar6);
            return bVar3;
          }
          bVar3 = std::operator==(local_38,"ALIAS_GLOBAL");
          OVar2 = variable_local._4_4_;
          if (bVar3) {
            pcVar5 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
            psVar1 = propertyName_local;
            this_00 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
            this_01 = cmMakefile::GetGlobalGenerator(this_00);
            bVar3 = cmGlobalGenerator::IsAlias(this_01,psStack_20);
            pcVar6 = "FALSE";
            if (bVar3) {
              pcVar6 = "TRUE";
            }
            bVar3 = (anonymous_namespace)::StoreResult<char_const*>(OVar2,pcVar5,psVar1,pcVar6);
            return bVar3;
          }
        }
        OVar2 = variable_local._4_4_;
        pcVar5 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
        status_local._7_1_ =
             StoreResult<std::nullptr_t>(OVar2,pcVar5,propertyName_local,(nullptr_t)0x0);
      }
      else {
        pcVar5 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
        local_80 = cmTarget::GetComputedProperty(this.Value,psVar1,pcVar5);
        bVar3 = cmValue::operator_cast_to_bool(&local_80);
        if (!bVar3) {
          local_88 = (string *)cmTarget::GetProperty(prop.Value,local_38);
          local_80 = (cmValue)local_88;
        }
        OVar2 = variable_local._4_4_;
        pcVar5 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
        local_90 = local_80.Value;
        status_local._7_1_ = StoreResult<cmValue>(OVar2,pcVar5,propertyName_local,local_80);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"not given name for TARGET scope.",&local_59);
    cmExecutionStatus::SetError((cmExecutionStatus *)psVar1,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    status_local._7_1_ = false;
  }
  return status_local._7_1_;
}

Assistant:

bool HandleTargetMode(cmExecutionStatus& status, const std::string& name,
                      OutType infoType, const std::string& variable,
                      const std::string& propertyName)
{
  if (name.empty()) {
    status.SetError("not given name for TARGET scope.");
    return false;
  }

  if (cmTarget* target = status.GetMakefile().FindTargetToUse(name)) {
    if (propertyName == "ALIASED_TARGET" || propertyName == "ALIAS_GLOBAL") {
      if (status.GetMakefile().IsAlias(name)) {
        if (propertyName == "ALIASED_TARGET") {

          return StoreResult(infoType, status.GetMakefile(), variable,
                             target->GetName().c_str());
        }
        if (propertyName == "ALIAS_GLOBAL") {
          return StoreResult(
            infoType, status.GetMakefile(), variable,
            status.GetMakefile().GetGlobalGenerator()->IsAlias(name)
              ? "TRUE"
              : "FALSE");
        }
      }
      return StoreResult(infoType, status.GetMakefile(), variable, nullptr);
    }
    cmValue prop =
      target->GetComputedProperty(propertyName, status.GetMakefile());
    if (!prop) {
      prop = target->GetProperty(propertyName);
    }
    return StoreResult(infoType, status.GetMakefile(), variable, prop);
  }
  status.SetError(cmStrCat("could not find TARGET ", name,
                           ".  Perhaps it has not yet been created."));
  return false;
}